

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> __thiscall
slang::parseList(slang *this,string_view value,bool allowCommaList,
                SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *splitMem)

{
  size_t sVar1;
  char *pcVar2;
  void *pvVar3;
  undefined7 in_register_00000009;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> *this_00
  ;
  slang *psVar4;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  this_00 = (span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
             *)CONCAT71(in_register_00000009,allowCommaList);
  local_40._M_str = (char *)value._M_len;
  local_40._M_len = (size_t)this;
  if ((int)value._M_str != 0) {
    while( true ) {
      pcVar2 = local_40._M_str;
      sVar1 = local_40._M_len;
      if ((slang *)local_40._M_len == (slang *)0x0) {
        psVar4 = (slang *)0xffffffffffffffff;
      }
      else {
        pvVar3 = memchr(local_40._M_str,0x2c,local_40._M_len);
        psVar4 = (slang *)(-(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)pcVar2);
      }
      if (psVar4 == (slang *)0xffffffffffffffff) break;
      local_30._M_len = sVar1;
      if (psVar4 <= sVar1) {
        local_30._M_len = (size_t)psVar4;
      }
      local_30._M_str = local_40._M_str;
      SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)this_00,
                 &local_30);
      if (local_40._M_len <= psVar4) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
      }
      local_40._M_len = local_40._M_len + -(long)(psVar4 + 1);
      local_40._M_str = local_40._M_str + (long)(psVar4 + 1);
    }
  }
  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
            ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)this_00,
             &local_40);
  return *this_00;
}

Assistant:

static std::span<const std::string_view> parseList(std::string_view value, bool allowCommaList,
                                                   SmallVector<std::string_view>& splitMem) {
    if (allowCommaList) {
        while (true) {
            auto index = value.find_first_of(',');
            if (index == std::string_view::npos)
                break;

            splitMem.push_back(value.substr(0, index));
            value = value.substr(index + 1);
        }
    }
    splitMem.push_back(value);
    return splitMem;
}